

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void Parser::
     MapBindIdentifierFromElement<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
               (ParseNodePtr elementNode,anon_class_40_5_07c1c418 handler)

{
  OpCode OVar1;
  FuncInfo *funcInfo;
  code *pcVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  DebuggerScope *pDVar6;
  ParseNodeVar *pPVar7;
  DiagExtraScopesType scopeType;
  
  if (elementNode->nop == knopEllipsis) {
    pPVar4 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (elementNode->nop != knopAsg) goto LAB_00825951;
    pPVar4 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar4->pnode1;
LAB_00825951:
  OVar1 = elementNode->nop;
  if ((OVar1 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
              (elementNode,handler);
    return;
  }
  if ((byte)(OVar1 + ~knopList) < 3) {
    if (*handler.debuggerScope == (DebuggerScope *)0x0) {
      if ((*handler.funcInfo)->paramScope == (Scope *)0x0) {
        scopeType = DiagParamScope;
      }
      else {
        scopeType = DiagParamScopeInObject -
                    (((*handler.funcInfo)->paramScope->field_0x44 & 2) == 0);
      }
      pDVar6 = ByteCodeGenerator::RecordStartScopeObject
                         (handler.this,&(*handler.pnodeFnc)->super_ParseNode,scopeType,0xffffffff,
                          (int *)0x0);
      *handler.debuggerScope = pDVar6;
      Js::DebuggerScope::SetBegin(pDVar6,*handler.beginOffset);
    }
    funcInfo = *handler.funcInfo;
    pDVar6 = *handler.debuggerScope;
    pPVar7 = ParseNode::AsParseNodeVar(elementNode);
    ByteCodeGenerator::InsertPropertyToDebuggerScope(handler.this,funcInfo,pDVar6,pPVar7->sym);
    return;
  }
  if (OVar1 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }